

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::SparseContext::SparseContext
          (SparseContext *this,Context *context)

{
  InstanceInterface *pIVar1;
  VkPhysicalDevice physicalDevice;
  long lVar2;
  NotSupportedError *this_00;
  VkQueue pVVar3;
  Allocator *pAVar4;
  pointer pVVar5;
  long lVar6;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_58;
  Move<vk::VkDevice_s_*> local_38;
  
  this->m_context = context;
  pIVar1 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceQueueFamilyProperties(&local_58,pIVar1,physicalDevice);
  if ((long)local_58.
            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_58.
            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar2 = ((long)local_58.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar6 = 0;
    pVVar5 = local_58.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((~pVVar5->queueFlags & 9) == 0) {
        operator_delete(local_58.
                        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        this->m_queueFamilyIndex = (deUint32)lVar6;
        createDevice(&local_38,this);
        local_58.
        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
        local_58.
        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_38.super_RefBase<vk::VkDevice_s_*>.m_data.object;
        local_58.
        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
        (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
             local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
        (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object =
             local_38.super_RefBase<vk::VkDevice_s_*>.m_data.object;
        (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
             local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
        pIVar1 = Context::getInstanceInterface(context);
        ::vk::DeviceDriver::DeviceDriver
                  (&this->m_deviceInterface,pIVar1,
                   (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object);
        pVVar3 = ::vk::getDeviceQueue
                           (&(this->m_deviceInterface).super_DeviceInterface,
                            (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                            this->m_queueFamilyIndex,0);
        this->m_queue = pVVar3;
        pAVar4 = createAllocator(this);
        (this->m_allocator).super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.
        m_data.ptr = pAVar4;
        return;
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar6);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"No matching queue found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
             ,0x26e);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderRenderCaseInstance::SparseContext::SparseContext (vkt::Context& context)
	: m_context				(context)
	, m_queueFamilyIndex	(findQueueFamilyIndexWithCaps(context.getInstanceInterface(), context.getPhysicalDevice(), VK_QUEUE_GRAPHICS_BIT|VK_QUEUE_SPARSE_BINDING_BIT))
	, m_device				(createDevice())
	, m_deviceInterface		(context.getInstanceInterface(), *m_device)
	, m_queue				(getDeviceQueue(m_deviceInterface, *m_device, m_queueFamilyIndex, 0))
	, m_allocator			(createAllocator())
{
}